

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O1

void __thiscall tst_GenericModel::moveRowsFromRootToBranch(tst_GenericModel *this)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  QAbstractItemModelTester *this_00;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  anon_union_24_3_e3d07ef4_for_data local_b8;
  ulong local_a0;
  QArrayData *local_98;
  storage_type_conflict *local_90;
  long *local_88;
  GenericModel testModel;
  ulong local_68 [2];
  long *local_58;
  QModelIndex parIndex;
  ModelTest probe;
  
  GenericModel::GenericModel(&testModel,(QObject *)0x0);
  this_00 = &probe.super_QAbstractItemModelTester;
  QAbstractItemModelTester::QAbstractItemModelTester
            (this_00,(QAbstractItemModel *)&testModel,QtTest,(QObject *)0x0);
  probe._0_8_ = &PTR_metaObject_001659f8;
  local_b8._forAlignment = -NAN;
  local_b8._8_8_ = 0;
  local_b8._16_8_ = 0;
  fillTable((tst_GenericModel *)this_00,(QAbstractItemModel *)&testModel,5,3,
            (QModelIndex *)&local_b8,0);
  local_b8._forAlignment = -NAN;
  local_b8._8_8_ = 0;
  local_b8._16_8_ = 0;
  GenericModel::index((int)&parIndex,(int)&testModel,(QModelIndex *)0x1);
  GenericModel::insertColumns((int)&testModel,0,(QModelIndex *)0x4);
  (**(code **)(_testModel + 0xf8))(&testModel,0,1,&parIndex);
  local_b8._forAlignment = -NAN;
  local_b8._8_8_ = 0;
  local_b8._16_8_ = 0;
  iVar5 = (int)&local_b8;
  bVar1 = (bool)GenericModel::moveRows
                          ((QModelIndex *)&testModel,iVar5,2,(QModelIndex *)0x2,(int)&parIndex);
  cVar2 = QTest::qVerify(bVar1,"testModel.moveRows(QModelIndex(), 2, 2, parIndex, 1)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x7a0);
  if (cVar2 != '\0') {
    iVar4 = GenericModel::rowCount((QModelIndex *)&testModel);
    cVar2 = QTest::qCompare(iVar4,3,"testModel.rowCount(parIndex)","3",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x7a1);
    if (cVar2 != '\0') {
      iVar4 = GenericModel::columnCount((QModelIndex *)&testModel);
      cVar2 = QTest::qCompare(iVar4,4,"testModel.columnCount(parIndex)","4",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x7a2);
      if (cVar2 != '\0') {
        local_b8._forAlignment = -NAN;
        local_b8._8_8_ = 0;
        local_b8._16_8_ = 0;
        iVar4 = GenericModel::rowCount((QModelIndex *)&testModel);
        cVar2 = QTest::qCompare(iVar4,3,"testModel.rowCount()","3",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x7a3);
        if (cVar2 != '\0') {
          local_b8._forAlignment = -NAN;
          local_b8._8_8_ = 0;
          local_b8._16_8_ = 0;
          iVar4 = GenericModel::columnCount((QModelIndex *)&testModel);
          cVar2 = QTest::qCompare(iVar4,3,"testModel.columnCount()","3",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x7a4);
          if (cVar2 != '\0') {
            GenericModel::index((int)local_68,(int)&testModel,(QModelIndex *)0x1);
            if (local_58 == (long *)0x0) {
              local_b8.shared = (PrivateShared *)0x0;
              local_b8._8_8_ = 0;
              local_b8._16_8_ = 0;
              local_a0 = 2;
            }
            else {
              (**(code **)(*local_58 + 0x90))(&local_b8,local_58,local_68,0);
            }
            QVariant::toString();
            QVar6.m_data = local_90;
            QVar6.m_size = (qsizetype)local_88;
            QVar13.m_data = L"2,0";
            QVar13.m_size = 3;
            cVar2 = QTest::qCompare(QVar6,QVar13,"testModel.index(1, 0, parIndex).data().toString()"
                                    ,"QStringLiteral(\"2,0\")",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x7a6);
            if (local_98 != (QArrayData *)0x0) {
              LOCK();
              (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_98,2,8);
              }
            }
            QVariant::~QVariant((QVariant *)&local_b8);
            if (cVar2 != '\0') {
              GenericModel::index((int)local_68,(int)&testModel,(QModelIndex *)0x2);
              if (local_58 == (long *)0x0) {
                local_b8.shared = (PrivateShared *)0x0;
                local_b8._8_8_ = 0;
                local_b8._16_8_ = 0;
                local_a0 = 2;
              }
              else {
                (**(code **)(*local_58 + 0x90))(&local_b8,local_58,local_68,0);
              }
              QVariant::toString();
              QVar7.m_data = local_90;
              QVar7.m_size = (qsizetype)local_88;
              QVar14.m_data = L"3,0";
              QVar14.m_size = 3;
              cVar2 = QTest::qCompare(QVar7,QVar14,
                                      "testModel.index(2, 0, parIndex).data().toString()",
                                      "QStringLiteral(\"3,0\")",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x7a7);
              if (local_98 != (QArrayData *)0x0) {
                LOCK();
                (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_98,2,8);
                }
              }
              QVariant::~QVariant((QVariant *)&local_b8);
              if (cVar2 != '\0') {
                GenericModel::index((int)local_68,(int)&testModel,(QModelIndex *)0x1);
                if (local_58 == (long *)0x0) {
                  local_b8.shared = (PrivateShared *)0x0;
                  local_b8._8_8_ = 0;
                  local_b8._16_8_ = 0;
                  local_a0 = 2;
                }
                else {
                  (**(code **)(*local_58 + 0x90))(&local_b8,local_58,local_68,0);
                }
                QVariant::toString();
                QVar8.m_data = local_90;
                QVar8.m_size = (qsizetype)local_88;
                QVar15.m_data = L"2,2";
                QVar15.m_size = 3;
                cVar2 = QTest::qCompare(QVar8,QVar15,
                                        "testModel.index(1, 2, parIndex).data().toString()",
                                        "QStringLiteral(\"2,2\")",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x7a8);
                if (local_98 != (QArrayData *)0x0) {
                  LOCK();
                  (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_98,2,8);
                  }
                }
                QVariant::~QVariant((QVariant *)&local_b8);
                if (cVar2 != '\0') {
                  GenericModel::index((int)local_68,(int)&testModel,(QModelIndex *)0x2);
                  if (local_58 == (long *)0x0) {
                    local_b8.shared = (PrivateShared *)0x0;
                    local_b8._8_8_ = 0;
                    local_b8._16_8_ = 0;
                    local_a0 = 2;
                  }
                  else {
                    (**(code **)(*local_58 + 0x90))(&local_b8,local_58,local_68,0);
                  }
                  QVariant::toString();
                  QVar9.m_data = local_90;
                  QVar9.m_size = (qsizetype)local_88;
                  QVar16.m_data = L"3,2";
                  QVar16.m_size = 3;
                  cVar2 = QTest::qCompare(QVar9,QVar16,
                                          "testModel.index(2, 2, parIndex).data().toString()",
                                          "QStringLiteral(\"3,2\")",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x7a9);
                  if (local_98 != (QArrayData *)0x0) {
                    LOCK();
                    (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_98,2,8);
                    }
                  }
                  QVariant::~QVariant((QVariant *)&local_b8);
                  if (cVar2 != '\0') {
                    GenericModel::index(iVar5,(int)&testModel,(QModelIndex *)0x1);
                    bVar1 = false;
                    if ((-1 < (int)local_b8._0_4_) && (bVar1 = false, -1 < (long)local_b8.shared)) {
                      bVar1 = local_b8._16_8_ != 0;
                    }
                    cVar2 = QTest::qVerify(bVar1,"testModel.index(1, 3, parIndex).isValid()","",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                           ,0x7aa);
                    if (cVar2 != '\0') {
                      GenericModel::index(iVar5,(int)&testModel,(QModelIndex *)0x2);
                      bVar1 = false;
                      if ((-1 < (int)local_b8._0_4_) && (bVar1 = false, -1 < (long)local_b8.shared))
                      {
                        bVar1 = local_b8._16_8_ != 0;
                      }
                      cVar2 = QTest::qVerify(bVar1,"testModel.index(2, 3, parIndex).isValid()","",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                             ,0x7ab);
                      if (cVar2 != '\0') {
                        GenericModel::index((int)&local_98,(int)&testModel,(QModelIndex *)0x1);
                        if (local_88 == (long *)0x0) {
                          local_b8.shared = (PrivateShared *)0x0;
                          local_b8._8_8_ = 0;
                          local_b8._16_8_ = 0;
                          local_a0 = 2;
                        }
                        else {
                          (**(code **)(*local_88 + 0x90))(&local_b8,local_88,&local_98,0);
                        }
                        local_68[0] = local_a0 & 0xfffffffffffffffc;
                        bVar3 = QMetaType::isValid();
                        cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                                               "!testModel.index(1, 3, parIndex).data().isValid()",
                                               "",
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                               ,0x7ac);
                        QVariant::~QVariant((QVariant *)&local_b8);
                        if (cVar2 != '\0') {
                          GenericModel::index((int)&local_98,(int)&testModel,(QModelIndex *)0x2);
                          if (local_88 == (long *)0x0) {
                            local_b8.shared = (PrivateShared *)0x0;
                            local_b8._8_8_ = 0;
                            local_b8._16_8_ = 0;
                            local_a0 = 2;
                          }
                          else {
                            (**(code **)(*local_88 + 0x90))(&local_b8,local_88,&local_98,0);
                          }
                          local_68[0] = local_a0 & 0xfffffffffffffffc;
                          bVar3 = QMetaType::isValid();
                          cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                                                 "!testModel.index(2, 3, parIndex).data().isValid()"
                                                 ,"",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                 ,0x7ad);
                          QVariant::~QVariant((QVariant *)&local_b8);
                          if (cVar2 != '\0') {
                            GenericModel::index((int)local_68,(int)&testModel,(QModelIndex *)0x0);
                            if (local_58 == (long *)0x0) {
                              local_b8.shared = (PrivateShared *)0x0;
                              local_b8._8_8_ = 0;
                              local_b8._16_8_ = 0;
                              local_a0 = 2;
                            }
                            else {
                              (**(code **)(*local_58 + 0x90))(&local_b8,local_58,local_68,0);
                            }
                            QVariant::toString();
                            QVar10.m_data = local_90;
                            QVar10.m_size = (qsizetype)local_88;
                            QVar17.m_data = L"0,0";
                            QVar17.m_size = 3;
                            cVar2 = QTest::qCompare(QVar10,QVar17,
                                                    "testModel.index(0, 0).data().toString()",
                                                    "QStringLiteral(\"0,0\")",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7ae);
                            if (local_98 != (QArrayData *)0x0) {
                              LOCK();
                              (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                                   (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                              UNLOCK();
                              if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                                QArrayData::deallocate(local_98,2,8);
                              }
                            }
                            QVariant::~QVariant((QVariant *)&local_b8);
                            if (cVar2 != '\0') {
                              GenericModel::index((int)local_68,(int)&testModel,(QModelIndex *)0x1);
                              if (local_58 == (long *)0x0) {
                                local_b8.shared = (PrivateShared *)0x0;
                                local_b8._8_8_ = 0;
                                local_b8._16_8_ = 0;
                                local_a0 = 2;
                              }
                              else {
                                (**(code **)(*local_58 + 0x90))(&local_b8,local_58,local_68,0);
                              }
                              QVariant::toString();
                              QVar11.m_data = local_90;
                              QVar11.m_size = (qsizetype)local_88;
                              QVar18.m_data = L"1,0";
                              QVar18.m_size = 3;
                              cVar2 = QTest::qCompare(QVar11,QVar18,
                                                      "testModel.index(1, 0).data().toString()",
                                                      "QStringLiteral(\"1,0\")",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7af);
                              if (local_98 != (QArrayData *)0x0) {
                                LOCK();
                                (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                                     (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                                UNLOCK();
                                if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                                  QArrayData::deallocate(local_98,2,8);
                                }
                              }
                              QVariant::~QVariant((QVariant *)&local_b8);
                              if (cVar2 != '\0') {
                                GenericModel::index((int)local_68,(int)&testModel,(QModelIndex *)0x2
                                                   );
                                if (local_58 == (long *)0x0) {
                                  local_b8.shared = (PrivateShared *)0x0;
                                  local_b8._8_8_ = 0;
                                  local_b8._16_8_ = 0;
                                  local_a0 = 2;
                                }
                                else {
                                  (**(code **)(*local_58 + 0x90))(&local_b8,local_58,local_68,0);
                                }
                                QVariant::toString();
                                QVar12.m_data = local_90;
                                QVar12.m_size = (qsizetype)local_88;
                                QVar19.m_data = L"4,0";
                                QVar19.m_size = 3;
                                cVar2 = QTest::qCompare(QVar12,QVar19,
                                                        "testModel.index(2, 0).data().toString()",
                                                        "QStringLiteral(\"4,0\")",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7b0);
                                if (local_98 != (QArrayData *)0x0) {
                                  LOCK();
                                  (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                                       (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                                  UNLOCK();
                                  if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0)
                                  {
                                    QArrayData::deallocate(local_98,2,8);
                                  }
                                }
                                QVariant::~QVariant((QVariant *)&local_b8);
                                if (cVar2 != '\0') {
                                  GenericModel::headerData(iVar5,(Orientation)&testModel,0);
                                  iVar4 = QVariant::toInt((bool *)local_b8.data);
                                  cVar2 = QTest::qCompare(iVar4,0,
                                                  "testModel.headerData(0, Qt::Vertical).toInt()",
                                                  "0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7b1);
                                  QVariant::~QVariant((QVariant *)&local_b8);
                                  if (cVar2 != '\0') {
                                    GenericModel::headerData(iVar5,(Orientation)&testModel,1);
                                    iVar4 = QVariant::toInt((bool *)local_b8.data);
                                    cVar2 = QTest::qCompare(iVar4,1,
                                                  "testModel.headerData(1, Qt::Vertical).toInt()",
                                                  "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7b2);
                                    QVariant::~QVariant((QVariant *)&local_b8);
                                    if (cVar2 != '\0') {
                                      GenericModel::headerData(iVar5,(Orientation)&testModel,2);
                                      iVar5 = QVariant::toInt((bool *)local_b8.data);
                                      QTest::qCompare(iVar5,4,
                                                  "testModel.headerData(2, Qt::Vertical).toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7b3);
                                      QVariant::~QVariant((QVariant *)&local_b8);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  QObject::~QObject((QObject *)&probe);
  GenericModel::~GenericModel(&testModel);
  return;
}

Assistant:

void tst_GenericModel::moveRowsFromRootToBranch()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    fillTable(&testModel, 5, 3);
    const QModelIndex parIndex = testModel.index(1, 0);
    testModel.insertColumns(0, 4, parIndex);
    testModel.insertRow(0, parIndex);

    QVERIFY(testModel.moveRows(QModelIndex(), 2, 2, parIndex, 1));
    QCOMPARE(testModel.rowCount(parIndex), 3);
    QCOMPARE(testModel.columnCount(parIndex), 4);
    QCOMPARE(testModel.rowCount(), 3);
    QCOMPARE(testModel.columnCount(), 3);

    QCOMPARE(testModel.index(1, 0, parIndex).data().toString(), QStringLiteral("2,0"));
    QCOMPARE(testModel.index(2, 0, parIndex).data().toString(), QStringLiteral("3,0"));
    QCOMPARE(testModel.index(1, 2, parIndex).data().toString(), QStringLiteral("2,2"));
    QCOMPARE(testModel.index(2, 2, parIndex).data().toString(), QStringLiteral("3,2"));
    QVERIFY(testModel.index(1, 3, parIndex).isValid());
    QVERIFY(testModel.index(2, 3, parIndex).isValid());
    QVERIFY(!testModel.index(1, 3, parIndex).data().isValid());
    QVERIFY(!testModel.index(2, 3, parIndex).data().isValid());
    QCOMPARE(testModel.index(0, 0).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(1, 0).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(2, 0).data().toString(), QStringLiteral("4,0"));
    QCOMPARE(testModel.headerData(0, Qt::Vertical).toInt(), 0);
    QCOMPARE(testModel.headerData(1, Qt::Vertical).toInt(), 1);
    QCOMPARE(testModel.headerData(2, Qt::Vertical).toInt(), 4);
}